

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::SparsemaxLoss::forward_impl
          (SparsemaxLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  float fVar1;
  Tensor *pTVar2;
  float *pfVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  Scalar *pSVar8;
  runtime_error *this_00;
  ulong uVar9;
  uint i;
  long rows;
  float fVar10;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 in_XMM5 [16];
  float tau;
  float local_228;
  float local_224;
  ulong local_220;
  Scalar local_214;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> sm;
  ConstantReturnType local_1d0;
  Tensor tsm;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  local_168;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
  local_128;
  CwiseBinaryOp<Eigen::internal::scalar_max_op<float,_float,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  local_c0;
  
  pTVar2 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((1 < (pTVar2->d).nd) && ((pTVar2->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"SparsemaxLoss not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar6 = (pTVar2->d).d[0];
  rows = (long)(int)uVar6;
  if (0x10000 < rows) {
    std::operator<<((ostream *)&std::cerr,
                    "MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.\n");
    abort();
  }
  pfVar3 = fx->v;
  pvVar4 = (this->super_Node).aux_mem;
  uVar9 = (ulong)uVar6;
  local_220 = (ulong)((long)(this->pq->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(this->pq->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
  auVar5 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,(int)local_220);
  local_228 = auVar5._0_4_;
  fVar10 = 1.0 / local_228;
  std::__partial_sort_copy<float*,float*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<float>>>
            (pTVar2->v,pTVar2->v + rows,pvVar4,(void *)((long)pvVar4 + rows * 4));
  uVar7 = 0;
  fVar1 = 0.0;
  do {
    fVar12 = fVar1;
    if (uVar9 == uVar7) goto LAB_0023627c;
    fVar1 = *(float *)((long)pvVar4 + uVar7 * 4);
    uVar7 = uVar7 + 1;
    auVar5 = vcvtusi2ss_avx512f(in_XMM5,(int)uVar7);
    auVar5 = vfmadd213ss_fma(auVar5,ZEXT416((uint)fVar1),SUB6416(ZEXT464(0x3f800000),0));
    fVar1 = fVar1 + fVar12;
  } while (fVar1 < auVar5._0_4_);
  uVar6 = (int)uVar7 - 1;
LAB_0023627c:
  auVar5 = vcvtusi2ss_avx512f(in_XMM5,uVar6);
  tau = (fVar12 + -1.0) / auVar5._0_4_;
  pTVar2 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  tsm.v = (float *)(this->super_Node).aux_mem;
  tsm.d.bd = (pTVar2->d).bd;
  tsm.d.d._0_8_ = *(undefined8 *)(pTVar2->d).d;
  tsm.d.d._8_8_ = *(undefined8 *)((pTVar2->d).d + 2);
  tsm.d.d._16_8_ = *(undefined8 *)((pTVar2->d).d + 4);
  tsm.d._24_8_ = *(undefined8 *)((pTVar2->d).d + 6);
  tsm.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tsm.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  Tensor::operator*(&x,pTVar2);
  Tensor::operator*(&sm,&tsm);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Ones(&local_1d0,rows,1);
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,-1,0,-1,-1>>>
  ::operator*(&local_168,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
               *)&local_1d0,&tau);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator-
            (&local_128,
             (MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>> *)&x,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
              *)&local_168);
  local_214 = 0.0;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>_>_>
  ::cwiseMax(&local_c0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>_>
              *)&local_128,&local_214);
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<float,float,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>const>>
            (&sm,&local_c0);
  *pfVar3 = 0.0;
  local_224 = tau * tau;
  for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    pSVar8 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)&sm,uVar7,0);
    if (*pSVar8 != 0.0) {
      pSVar8 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)&x,uVar7,0);
      auVar5 = vfmsub213ss_fma(ZEXT416((uint)*pSVar8),ZEXT416((uint)*pSVar8),
                               ZEXT416((uint)local_224));
      *pfVar3 = auVar5._0_4_ + *pfVar3;
    }
  }
  uVar9 = local_220 & 0xffffffff;
  uVar7 = 0;
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)local_228),ZEXT416((uint)(fVar10 * fVar10)),
                           ZEXT416((uint)*pfVar3));
  fVar1 = auVar5._0_4_ * 0.5;
  auVar11 = ZEXT464((uint)fVar1);
  *pfVar3 = fVar1;
  while (uVar9 != uVar7) {
    pSVar8 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)&x,(ulong)(this->pq->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar7],0);
    uVar7 = uVar7 + 1;
    auVar5 = vfnmadd213ss_fma(ZEXT416((uint)*pSVar8),ZEXT416((uint)fVar10),ZEXT416((uint)*pfVar3));
    auVar11 = ZEXT1664(auVar5);
    *pfVar3 = auVar5._0_4_;
  }
  if (auVar11._0_4_ < 0.0) {
    *pfVar3 = 0.0;
  }
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&tsm.bs);
  return;
}

Assistant:

void SparsemaxLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
#if HAVE_CUDA
    throw std::runtime_error("SparsemaxLoss not implemented on GPU");
#else
    const int rows = xs[0]->d.rows();
    if (rows > MAX_SPARSEMAX_LOSS_ROWS) {
      cerr << "MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.\n";
      abort();
    }
    float& y = fx.v[0];  // loss
    const unsigned qsupport_size = pq->size();
    const float qprop = 1.f / qsupport_size;

    float *zs = static_cast<float*>(aux_mem);
    std::partial_sort_copy(xs[0]->v, xs[0]->v+rows, zs, zs + rows, std::greater<float>());
    float sum = 0, maxsum = 0;
    unsigned k = 0;
    for (k = 0; k < rows; ++k) {
      sum += zs[k];
      float t = 1 + (k + 1) * zs[k];
      if (t <= sum) break;
      maxsum = sum;
    }
    float tau = (maxsum - 1) / k;
    Tensor tsm(xs[0]->d, (float*)aux_mem);
    auto x = **xs[0];
    auto sm = *tsm;
    sm = (x - Eigen::MatrixXf::Ones(rows, 1)*tau).cwiseMax(0.f);
    //cerr << "SpM: " << (sm).transpose() << " |||";
    //for (unsigned i = 0; i < pq->size(); ++i) cerr << ' ' << (*pq)[i];
    //cerr << endl;
    y = 0;
    float tau_sq = tau * tau;
    for (unsigned i = 0; i < rows; ++i) {
      if (sm(i, 0)) {
        const float x_s = x(i, 0);
        y += x_s * x_s - tau_sq;
      }
    }
    y /= 2;
    y += qprop * qprop * qsupport_size / 2;
    for (unsigned i = 0; i < qsupport_size; ++i)
      y -= qprop * x((*pq)[i], 0);
    if (y < 0) y = 0;
#endif
  } else {
    throw std::runtime_error("SparsemaxLoss not yet implemented for multiple columns");
  }
}